

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_mask.cpp
# Opt level: O0

void __thiscall
cppurses::detail::Screen_mask::Screen_mask(Screen_mask *this,Widget *w,Constructor_tag tag)

{
  size_t sVar1;
  size_t sVar2;
  Point PVar3;
  Area AVar4;
  allocator<bool> local_1d;
  Constructor_tag local_1c;
  Widget *pWStack_18;
  Constructor_tag tag_local;
  Widget *w_local;
  Screen_mask *this_local;
  
  local_1c = tag;
  pWStack_18 = w;
  w_local = (Widget *)this;
  PVar3 = anon_unknown.dwarf_1af3db::make_offset(w,tag);
  this->offset_ = PVar3;
  AVar4 = anon_unknown.dwarf_1af3db::make_area(pWStack_18,local_1c);
  this->area_ = AVar4;
  sVar1 = (this->area_).width;
  sVar2 = (this->area_).height;
  std::allocator<bool>::allocator(&local_1d);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->bits_,sVar1 * sVar2,&local_1d);
  std::allocator<bool>::~allocator(&local_1d);
  return;
}

Assistant:

Screen_mask::Screen_mask(const Widget& w, Constructor_tag tag)
    : offset_{make_offset(w, tag)},
      area_{make_area(w, tag)},
      bits_(area_.width * area_.height) {}